

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<float,_long,_1,_2,_false,_0,_0,_1>::run
               (long size,long otherSize,float *_tri,long triStride,float *_other,long otherIncr,
               long otherStride,level3_blocking<float,_float> *blocking)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined8 uVar4;
  long *plVar5;
  ulong size_00;
  ulong size_01;
  LhsScalar *pLVar6;
  RhsScalar *pRVar7;
  undefined1 *puVar8;
  ulong *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  undefined1 auStack_688 [8];
  float *local_680;
  float *local_678;
  float *local_670;
  long local_668;
  bool local_660;
  undefined7 uStack_65f;
  long local_658;
  float *local_650;
  float *local_648;
  long local_640;
  bool local_638;
  undefined7 uStack_637;
  long local_630;
  float *local_628;
  float *local_620;
  float local_614;
  long local_610;
  float *local_608;
  ulong local_600;
  ulong local_5f8;
  float *local_5f0;
  float *local_5e8;
  float *local_5e0;
  float *local_5d8;
  float *local_5d0;
  LhsScalar *local_5c8;
  LhsScalar *local_5c0;
  blas_data_mapper<float,_long,_0,_0,_1> local_5b8;
  const_blas_data_mapper<float,_long,_0> local_5a8;
  long local_598;
  long local_590;
  long actual_mc;
  long i2;
  long end;
  long start;
  float *local_568;
  const_blas_data_mapper<float,_long,_0> local_560;
  long local_550;
  long startTarget;
  float *local_540;
  long local_538;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  LinearMapper l;
  LinearMapper r;
  float b;
  float *otherij;
  long j;
  float a;
  long s;
  long rs;
  long i;
  long k;
  long local_4c0;
  long local_4b8;
  long actualPanelWidth;
  long k1;
  long local_4a0;
  long actual_cols;
  long j2;
  long local_488;
  long actual_kc;
  long k2;
  long local_470;
  ulong local_468;
  long subcols;
  ptrdiff_t l3;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_440 [4];
  gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
  pack_lhs;
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<float> blockB_stack_memory_destructor;
  float *blockB;
  undefined1 local_410 [8];
  aligned_stack_memory_handler<float> blockA_stack_memory_destructor;
  float *blockA;
  size_t sizeB;
  size_t sizeA;
  long local_3d8;
  long mc;
  long kc;
  OtherMapper other;
  TriMapper tri;
  long cols;
  long otherIncr_local;
  float *_other_local;
  long triStride_local;
  float *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_368;
  long local_360;
  float *local_358;
  long *local_350;
  long local_348;
  long local_340;
  long *local_338;
  undefined8 local_330;
  long local_328;
  float *local_320;
  long *local_318;
  long local_310;
  long local_308;
  float *local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long *local_2e0;
  undefined1 local_2d8 [16];
  long local_2c8;
  float *local_2c0;
  undefined1 *local_2b8;
  long local_2b0;
  long local_2a8;
  long *local_2a0;
  undefined8 local_298;
  long local_290;
  float *local_288;
  undefined1 *local_280;
  long local_278;
  long local_270;
  long *local_268;
  undefined1 local_260 [16];
  long local_250;
  float *local_248;
  undefined1 *local_240;
  long local_238;
  long local_230;
  long *local_228;
  undefined8 local_220;
  long local_218;
  float *local_210;
  undefined1 *local_208;
  undefined8 local_200;
  long local_1f8;
  long *local_1f0;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  float *local_1d0;
  float *local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  long local_1b0;
  long *local_1a8;
  undefined1 local_1a0 [16];
  undefined8 local_190;
  float *local_188;
  long local_180;
  undefined1 *local_178;
  long local_170;
  long local_168;
  long *local_160;
  undefined1 local_158 [16];
  undefined8 local_148;
  float *local_140;
  long local_138;
  undefined1 *local_130;
  long local_128;
  long local_120;
  long *local_118;
  undefined1 local_110 [8];
  long local_108;
  long local_100;
  long *local_f8;
  long local_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined1 *local_d0;
  float *local_c8;
  long local_c0;
  long *local_b8;
  undefined1 local_b0 [8];
  float *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long *local_80;
  long local_78;
  long local_70;
  long *local_68;
  undefined8 local_60;
  long local_58;
  long *local_50;
  float *local_48;
  long local_40;
  long *local_38;
  undefined8 local_30;
  float *local_28;
  undefined1 *local_20;
  long local_18;
  LinearMapper *local_10;
  
  puVar8 = auStack_688;
  local_350 = &other.m_stride;
  local_330 = 1;
  local_2f8 = &kc;
  local_308 = otherStride;
  other.m_data = (float *)otherStride;
  otherSize_local = size;
  local_360 = triStride;
  local_358 = _tri;
  local_328 = triStride;
  local_320 = _tri;
  local_318 = local_350;
  local_310 = otherIncr;
  local_300 = _other;
  kc = (long)_other;
  other.m_stride = (long)_tri;
  if (otherIncr == 1) {
    mc = level3_blocking<float,_float>::kc(blocking);
    sizeA = level3_blocking<float,_float>::mc(blocking);
    plVar5 = std::min<long>(&otherSize_local,(long *)&sizeA);
    local_3d8 = *plVar5;
    size_00 = mc * local_3d8;
    size_01 = mc * otherSize;
    local_368 = size_00;
    if (0x3fffffffffffffff < size_00) {
      throw_std_bad_alloc();
    }
    pLVar6 = level3_blocking<float,_float>::blockA(blocking);
    if (pLVar6 == (LhsScalar *)0x0) {
      if (size_00 * 4 < 0x20001) {
        lVar10 = -(size_00 * 4 + 0x1e & 0xfffffffffffffff0);
        puVar8 = auStack_688 + lVar10;
        local_5c8 = (LhsScalar *)((long)&local_680 + lVar10);
      }
      else {
        local_5c8 = (LhsScalar *)aligned_malloc(size_00 * 4);
      }
      local_5c0 = local_5c8;
    }
    else {
      local_5c0 = level3_blocking<float,_float>::blockA(blocking);
      puVar8 = auStack_688;
    }
    blockA_stack_memory_destructor._16_8_ = local_5c0;
    *(undefined8 *)(puVar8 + -8) = 0x2a9b39;
    pLVar6 = level3_blocking<float,_float>::blockA(blocking);
    if (pLVar6 == (LhsScalar *)0x0) {
      local_5d0 = (float *)blockA_stack_memory_destructor._16_8_;
    }
    else {
      local_5d0 = (float *)0x0;
    }
    pfVar3 = local_5d0;
    *(undefined8 *)(puVar8 + -8) = 0x2a9b8e;
    aligned_stack_memory_handler<float>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_410,pfVar3,size_00,0x20000 < size_00 * 4
              );
    size_local = size_01;
    if (0x3fffffffffffffff < size_01) {
      *(undefined8 *)(puVar8 + -8) = 0x2a9bb4;
      throw_std_bad_alloc();
    }
    *(undefined8 *)(puVar8 + -8) = 0x2a9bc3;
    pRVar7 = level3_blocking<float,_float>::blockB(blocking);
    if (pRVar7 == (RhsScalar *)0x0) {
      if (size_01 * 4 < 0x20001) {
        puVar8 = puVar8 + -(size_01 * 4 + 0x1e & 0xfffffffffffffff0);
        local_5e0 = (float *)((ulong)(puVar8 + 0xf) & 0xfffffffffffffff0);
      }
      else {
        *(undefined8 *)(puVar8 + -8) = 0x2a9c2f;
        local_5e8 = (float *)aligned_malloc(size_01 * 4);
        local_5e0 = local_5e8;
      }
      local_5d8 = local_5e0;
    }
    else {
      *(undefined8 *)(puVar8 + -8) = 0x2a9bd2;
      local_5d8 = level3_blocking<float,_float>::blockB(blocking);
    }
    pfVar3 = local_5d8;
    *(undefined8 *)(puVar8 + -8) = 0x2a9c6d;
    pRVar7 = level3_blocking<float,_float>::blockB(blocking);
    if (pRVar7 == (RhsScalar *)0x0) {
      local_5f0 = pfVar3;
    }
    else {
      local_5f0 = (float *)0x0;
    }
    pfVar15 = local_5f0;
    *(undefined8 *)(puVar8 + -8) = 0x2a9cbb;
    aligned_stack_memory_handler<float>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_440,pfVar15,size_01,
               0x20000 < size_01 * 4);
    *(undefined8 *)(puVar8 + -8) = 0x2a9cd9;
    manage_caching_sizes(GetAction,&l2,&l3,&subcols);
    if (otherSize < 1) {
      local_5f8 = 0;
    }
    else {
      local_600 = l3;
      *(undefined8 *)(puVar8 + -8) = 0x2a9d03;
      plVar5 = std::max<long>(&otherStride,&otherSize_local);
      local_5f8 = local_600 / (ulong)(*plVar5 << 4);
    }
    local_468 = local_5f8;
    local_470 = (long)local_5f8 / 4 << 2;
    k2 = 4;
    *(undefined8 *)(puVar8 + -8) = 0x2a9d75;
    puVar9 = (ulong *)std::max<long>(&local_470,&k2);
    local_468 = *puVar9;
    for (actual_kc = otherSize_local; 0 < actual_kc; actual_kc = actual_kc - mc) {
      j2 = actual_kc;
      *(undefined8 *)(puVar8 + -8) = 0x2a9dbc;
      plVar5 = std::min<long>(&j2,&mc);
      local_488 = *plVar5;
      for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_468 + actual_cols) {
        k1 = otherSize - actual_cols;
        *(undefined8 *)(puVar8 + -8) = 0x2a9e0d;
        plVar5 = std::min<long>(&k1,(long *)&local_468);
        local_4a0 = *plVar5;
        for (actualPanelWidth = 0; actualPanelWidth < local_488;
            actualPanelWidth = actualPanelWidth + 8) {
          local_4c0 = local_488 - actualPanelWidth;
          k = 8;
          *(undefined8 *)(puVar8 + -8) = 0x2a9e69;
          plVar5 = std::min<long>(&local_4c0,&k);
          local_4b8 = *plVar5;
          for (i = 0; lVar12 = local_488, lVar11 = local_4a0, lVar10 = local_4b8, i < local_4b8;
              i = i + 1) {
            lVar10 = ((actual_kc - actualPanelWidth) - i) + -1;
            lVar11 = (local_4b8 - i) + -1;
            lVar12 = lVar10 - lVar11;
            local_338 = &other.m_stride;
            pfVar15 = (float *)(other.m_stride + (lVar10 + lVar10 * triStride) * 4);
            local_348 = lVar10;
            local_340 = lVar10;
            *(undefined8 *)(puVar8 + -8) = 0x2a9f3d;
            pfVar15 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pfVar15);
            fVar1 = *pfVar15;
            for (otherij = (float *)actual_cols; (long)otherij < actual_cols + local_4a0;
                otherij = (float *)((long)otherij + 1)) {
              local_38 = &kc;
              local_40 = lVar10;
              local_48 = otherij;
              pfVar15 = (float *)(kc + (lVar10 + (long)otherij * (long)other.m_data) * 4);
              *pfVar15 = (1.0 / fVar1) * *pfVar15;
              fVar2 = *pfVar15;
              local_b8 = &kc;
              local_c0 = lVar12;
              local_c8 = otherij;
              local_98 = &kc;
              local_a0 = lVar12;
              local_a8 = otherij;
              local_28 = (float *)(kc + (lVar12 + (long)otherij * (long)other.m_data) * 4);
              local_20 = local_b0;
              local_30 = 1;
              local_608 = local_28;
              l.m_data = local_28;
              local_118 = &other.m_stride;
              local_120 = lVar12;
              local_128 = lVar10;
              local_f8 = &other.m_stride;
              local_100 = lVar12;
              local_108 = lVar10;
              local_d8 = other.m_stride + (lVar12 + lVar10 * triStride) * 4;
              local_d0 = local_110;
              local_e0 = 1;
              local_610 = local_d8;
              i3 = local_d8;
              for (lengthTarget = 0; lengthTarget < lVar11; lengthTarget = lengthTarget + 1) {
                local_e8 = &i3;
                local_f0 = lengthTarget;
                pfVar15 = (float *)(i3 + lengthTarget * 4);
                local_614 = fVar2;
                *(undefined8 *)(puVar8 + -8) = 0x2aa22c;
                pfVar15 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pfVar15);
                local_10 = &l;
                local_18 = lengthTarget;
                l.m_data[lengthTarget] = -local_614 * *pfVar15 + l.m_data[lengthTarget];
              }
            }
          }
          startBlock = (local_488 - actualPanelWidth) - local_4b8;
          blockBOffset = (actual_kc - actualPanelWidth) - local_4b8;
          local_538 = startBlock;
          lVar13 = local_488 * actual_cols;
          local_620 = pfVar3 + lVar13;
          local_160 = &kc;
          local_168 = blockBOffset;
          local_170 = actual_cols;
          local_80 = &kc;
          local_88 = blockBOffset;
          local_90 = actual_cols;
          local_138 = kc + (blockBOffset + actual_cols * (long)other.m_data) * 4;
          local_130 = local_158;
          local_140 = other.m_data;
          local_148 = 1;
          local_630 = local_138;
          local_628 = other.m_data;
          startTarget = local_138;
          local_540 = other.m_data;
          *(long *)(puVar8 + -0x10) = startBlock;
          *(undefined8 *)(puVar8 + -0x18) = 0x2aa4bd;
          gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
          ::operator()((gemm_pack_rhs<float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_4,_0,_false,_true>
                        *)((long)&l1 + 4),pfVar3 + lVar13,
                       (blas_data_mapper<float,_long,_0,_0,_1> *)&startTarget,lVar10,lVar11,lVar12,
                       *(long *)(puVar8 + -0x10));
          uVar4 = blockA_stack_memory_destructor._16_8_;
          lVar11 = local_4b8;
          lVar10 = startBlock;
          if (0 < startBlock) {
            local_550 = actual_kc - local_488;
            local_638 = blockA_stack_memory_destructor.m_deallocate;
            uStack_637 = blockA_stack_memory_destructor._17_7_;
            local_268 = &other.m_stride;
            local_270 = local_550;
            local_278 = blockBOffset;
            local_228 = &other.m_stride;
            local_230 = local_550;
            local_238 = blockBOffset;
            local_248 = (float *)(other.m_stride + (local_550 + blockBOffset * triStride) * 4);
            local_240 = local_260;
            local_250 = triStride;
            local_208 = local_260;
            local_210 = local_248;
            local_218 = triStride;
            local_220 = 1;
            local_648 = local_248;
            local_640 = triStride;
            local_560.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = local_248;
            local_560.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = triStride;
            *(undefined8 *)(puVar8 + -0x10) = 0;
            *(undefined8 *)(puVar8 + -0x18) = 0x2aa67c;
            gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
            ::operator()((gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
                          *)((long)&l1 + 5),(float *)uVar4,&local_560,lVar11,lVar10,0,
                         *(long *)(puVar8 + -0x10));
            uVar4 = blockA_stack_memory_destructor._16_8_;
            lVar13 = local_488;
            lVar12 = local_4a0;
            lVar11 = local_4b8;
            lVar10 = startBlock;
            local_1a8 = &kc;
            local_1b0 = local_550;
            local_1b8 = actual_cols;
            local_68 = &kc;
            local_70 = local_550;
            local_78 = actual_cols;
            local_180 = kc + (local_550 + actual_cols * (long)other.m_data) * 4;
            local_178 = local_1a0;
            local_188 = other.m_data;
            local_190 = 1;
            local_658 = local_180;
            local_650 = other.m_data;
            start = local_180;
            local_568 = other.m_data;
            lVar14 = local_488 * actual_cols;
            *(long *)(puVar8 + -0x10) = local_538;
            *(long *)(puVar8 + -0x20) = lVar13;
            *(long *)(puVar8 + -0x28) = lVar11;
            *(long *)(puVar8 + -0x30) = lVar12;
            *(undefined8 *)(puVar8 + -0x18) = 0;
            *(undefined8 *)(puVar8 + -0x38) = 0x2aa80f;
            gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
            ::operator()((gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
                          *)((long)&l1 + 6),(blas_data_mapper<float,_long,_0,_0,_1> *)&start,
                         (float *)uVar4,pfVar3 + lVar14,lVar10,lVar11,*(long *)(puVar8 + -0x30),-1.0
                         ,*(long *)(puVar8 + -0x28),*(long *)(puVar8 + -0x20),
                         *(long *)(puVar8 + -0x18),*(long *)(puVar8 + -0x10));
          }
        }
      }
      end = 0;
      i2 = actual_kc - mc;
      for (actual_mc = 0; actual_mc < i2; actual_mc = local_3d8 + actual_mc) {
        local_598 = i2 - actual_mc;
        *(undefined8 *)(puVar8 + -8) = 0x2aa8b6;
        plVar5 = std::min<long>(&local_3d8,&local_598);
        uVar4 = blockA_stack_memory_destructor._16_8_;
        lVar11 = local_488;
        lVar10 = *plVar5;
        local_590 = lVar10;
        if (0 < lVar10) {
          local_660 = blockA_stack_memory_destructor.m_deallocate;
          uStack_65f = blockA_stack_memory_destructor._17_7_;
          local_2f0 = actual_kc - mc;
          local_2e0 = &other.m_stride;
          local_2e8 = actual_mc;
          local_2a0 = &other.m_stride;
          local_2a8 = actual_mc;
          local_2b0 = local_2f0;
          local_2c0 = (float *)(other.m_stride + (actual_mc + local_2f0 * triStride) * 4);
          local_2b8 = local_2d8;
          local_2c8 = triStride;
          local_280 = local_2d8;
          local_288 = local_2c0;
          local_290 = triStride;
          local_298 = 1;
          local_670 = local_2c0;
          local_668 = triStride;
          local_5a8.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data = local_2c0;
          local_5a8.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = triStride;
          *(undefined8 *)(puVar8 + -0x10) = 0;
          *(undefined8 *)(puVar8 + -0x18) = 0x2aaa6b;
          gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
          ::operator()((gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_0,_false,_false>
                        *)((long)&l1 + 5),(float *)uVar4,&local_5a8,lVar11,lVar10,0,
                       *(long *)(puVar8 + -0x10));
          uVar4 = blockA_stack_memory_destructor._16_8_;
          lVar11 = local_488;
          lVar10 = local_590;
          local_1f0 = &kc;
          local_1f8 = actual_mc;
          local_200 = 0;
          local_50 = &kc;
          local_58 = actual_mc;
          local_60 = 0;
          local_1c8 = (float *)(kc + actual_mc * 4);
          local_1c0 = local_1e8;
          local_1d0 = other.m_data;
          local_1d8 = 1;
          local_680 = local_1c8;
          local_678 = other.m_data;
          local_5b8.m_data = local_1c8;
          local_5b8.m_stride = (long)other.m_data;
          *(long *)(puVar8 + -0x30) = otherSize;
          *(undefined8 *)(puVar8 + -0x10) = 0;
          *(undefined8 *)(puVar8 + -0x18) = 0;
          *(undefined8 *)(puVar8 + -0x20) = 0xffffffffffffffff;
          *(undefined8 *)(puVar8 + -0x28) = 0xffffffffffffffff;
          *(undefined8 *)(puVar8 + -0x38) = 0x2aabe7;
          gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
          ::operator()((gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
                        *)((long)&l1 + 6),&local_5b8,(float *)uVar4,pfVar3,lVar10,lVar11,
                       *(long *)(puVar8 + -0x30),-1.0,*(long *)(puVar8 + -0x28),
                       *(long *)(puVar8 + -0x20),*(long *)(puVar8 + -0x18),*(long *)(puVar8 + -0x10)
                      );
        }
      }
    }
    *(undefined8 *)(puVar8 + -8) = 0x2aac36;
    aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_440);
    *(undefined8 *)(puVar8 + -8) = 0x2aac42;
    aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<float> *)local_410);
    return;
  }
  __assert_fail("incr==1",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/BlasUtil.h"
                ,0xae,
                "Eigen::internal::blas_data_mapper<float, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = float, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
               );
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }